

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall cs_impl::any::any<cs::lang_error>(any *this,lang_error *dat)

{
  pointer pcVar1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((_DAT_0025adf0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x28);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::type_t>::allocator + _DAT_0025adf0 * 8);
    _DAT_0025adf0 = _DAT_0025adf0 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_002519c8;
  pbVar2[1]._vptr_baseHolder = (_func_int **)(pbVar2 + 3);
  pcVar1 = (dat->mWhat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar2 + 1),pcVar1,pcVar1 + (dat->mWhat)._M_string_length);
  if ((DAT_0025be20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_0025be20];
    DAT_0025be20 = DAT_0025be20 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 0;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}